

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  pointer *ppiVar1;
  pointer pcVar2;
  char cVar3;
  bool bVar4;
  ostream *poVar5;
  _Node *p_Var6;
  long *plVar7;
  pointer pbVar8;
  int *__value;
  ulong uVar9;
  _Alloc_hider _Var10;
  int iVar11;
  long lVar12;
  long lVar13;
  long *local_c8 [2];
  long local_b8 [2];
  pointer local_a8;
  undefined1 local_a0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pieces;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  subs;
  undefined1 auStack_68 [4];
  int n;
  vector<int,_std::allocator<int>_> perm;
  string sub;
  
  std::istream::operator>>
            ((istream *)&std::cin,
             (int *)((long)&subs.
                            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl._M_node._M_size + 4));
  std::istream::ignore();
  pieces.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&pieces.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  subs.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  iVar11 = 0;
  subs.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)
       pieces.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (0 < subs.
          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl._M_node._M_size._4_4_) {
    ppiVar1 = &perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage;
    do {
      perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)&sub._M_string_length;
      sub._M_dataplus._M_p = (pointer)0x0;
      sub._M_string_length._0_1_ = 0;
      cVar3 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -8);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,(string *)ppiVar1,cVar3);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,
                          (char *)perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,
                          (long)sub._M_dataplus._M_p);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      p_Var6 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
               _M_create_node<std::__cxx11::string_const&>
                         ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                          &pieces.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ppiVar1);
      std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
      subs.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_prev =
           (_List_node_base *)
           ((long)&(subs.
                    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl._M_node.super__List_node_base._M_prev)->_M_next + 1);
      if ((size_type *)
          perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage != &sub._M_string_length) {
        operator_delete(perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                        CONCAT71(sub._M_string_length._1_7_,(undefined1)sub._M_string_length) + 1);
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 < subs.
                      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl._M_node._M_size._4_4_);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_a0,
           (size_type)
           subs.
           super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_prev,
           (allocator_type *)
           &perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)auStack_68,
             (size_type)
             subs.
             super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl._M_node.super__List_node_base._M_prev,
             (allocator_type *)
             &perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  if (pieces.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage ==
      (pointer)&pieces.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    _Var10._M_p = (pointer)0x0;
  }
  else {
    lVar12 = 0;
    lVar13 = 0;
    _Var10._M_p = (pointer)0x0;
    pbVar8 = pieces.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    do {
      _auStack_68[lVar13] = (int)lVar13;
      std::__cxx11::string::_M_assign((string *)((long)&((_Alloc_hider *)local_a0)->_M_p + lVar12));
      _Var10._M_p = _Var10._M_p + *(long *)((long)&pbVar8->field_2 + 8);
      lVar13 = lVar13 + 1;
      pbVar8 = (pointer)(pbVar8->_M_dataplus)._M_p;
      lVar12 = lVar12 + 0x20;
    } while (pbVar8 != (pointer)&pieces.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  ppiVar1 = &perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  do {
    perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)&std::cerr;
    sub._M_dataplus._M_p = ", ";
    lVar12 = (long)perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start - (long)_auStack_68 >> 2;
    if (0 < lVar12) {
      uVar9 = lVar12 + 1;
      __value = _auStack_68;
      do {
        std::ostream_iterator<int,_char,_std::char_traits<char>_>::operator=
                  ((ostream_iterator<int,_char,_std::char_traits<char>_> *)ppiVar1,__value);
        __value = __value + 1;
        uVar9 = uVar9 - 1;
      } while (1 < uVar9);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x18');
    std::ostream::put('\x18');
    std::ostream::flush();
    perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)&sub._M_string_length;
    pcVar2 = (((pointer)((long)local_a0 + (long)*_auStack_68 * 0x20))->_M_dataplus)._M_p;
    local_a8 = _Var10._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)ppiVar1,pcVar2,
               pcVar2 + ((pointer)((long)local_a0 + (long)*_auStack_68 * 0x20))->_M_string_length);
    if (4 < (ulong)((long)perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start - (long)_auStack_68)) {
      uVar9 = 1;
      do {
        iVar11 = get_intersection((string *)ppiVar1,
                                  (string *)((long)local_a0 + (long)_auStack_68[uVar9] * 0x20));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"r is ",5);
        plVar7 = (long *)std::ostream::operator<<((ostream *)&std::cerr,iVar11);
        std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
        std::ostream::put((char)plVar7);
        std::ostream::flush();
        std::__cxx11::string::substr((ulong)local_c8,(ulong)ppiVar1);
        std::__cxx11::string::operator=((string *)ppiVar1,(string *)local_c8);
        if (local_c8[0] != local_b8) {
          operator_delete(local_c8[0],local_b8[0] + 1);
        }
        std::__cxx11::string::_M_append
                  ((char *)ppiVar1,
                   (ulong)(((pointer)((long)local_a0 + (long)_auStack_68[uVar9] * 0x20))->
                          _M_dataplus)._M_p);
        uVar9 = uVar9 + 1;
      } while (uVar9 < (ulong)((long)perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start - (long)_auStack_68 >> 2));
    }
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,
                        (char *)perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,(long)sub._M_dataplus._M_p
                       );
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    _Var10._M_p = local_a8;
    if (sub._M_dataplus._M_p <= local_a8) {
      _Var10 = sub._M_dataplus;
    }
    if ((size_type *)
        perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage != &sub._M_string_length) {
      operator_delete(perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                      CONCAT71(sub._M_string_length._1_7_,(undefined1)sub._M_string_length) + 1);
    }
    bVar4 = std::
            __next_permutation<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (_auStack_68,
                       perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start);
  } while (bVar4);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if (_auStack_68 != (int *)0x0) {
    operator_delete(_auStack_68,
                    (long)perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)_auStack_68);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_a0);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&pieces.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return 0;
}

Assistant:

int main()
{
	int n;
	std::cin >> n;
	std::cin.ignore();
	
	std::list<std::string> subs;
	for (int i = 0; i < n; i++)
	{
	    std::string sub;
		std::getline(std::cin, sub);
		std::cerr << sub << std::endl;
        subs.push_back(sub);
	}
	
	int j = 0;
	size_t result = 0;
	std::vector<std::string> pieces(subs.size());
	std::vector<int> perm(subs.size());
	for (std::list<std::string>::const_iterator i = subs.begin(); i != subs.end(); i++)
	{
	    perm[j] = j;
	    pieces[j] = *i;
	    result += i->length();
	    j++;
	}

	do
	{
	    copy(perm.begin(), perm.end(), std::ostream_iterator<int>(std::cerr, ", "));
	    std::cerr << std::endl;
	    
	    std::string s = pieces[perm[0]];
	    for (size_t i = 1; i < perm.size(); i++)
	    {
	        int r = get_intersection(s, pieces[perm[i]]);
	        std::cerr << "r is " << r << std::endl;
	        s = s.substr(0, s.length() - r);
	        s += pieces[perm[i]];
	    }
	    std::cerr << s << std::endl;
	    if (result > s.length())
	    {
	        result = s.length();
	    }
	} while (next_permutation(perm.begin(), perm.end()));

    std::cout << result << std::endl;

    return 0;
}